

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionary.h
# Opt level: O3

void __thiscall
FIX::DataDictionary::checkHasRequired
          (DataDictionary *this,FieldMap *header,FieldMap *body,FieldMap *trailer,MsgType *msgType)

{
  string *__k;
  _Rb_tree_color _Var1;
  FieldMap *header_00;
  DataDictionary *pDVar2;
  NonBodyFields *pNVar3;
  bool bVar4;
  __normal_iterator<const_FIX::FieldBase_*,_std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>_>
  _Var5;
  _Rb_tree_node_base *p_Var6;
  const_iterator cVar7;
  __normal_iterator<const_FIX::FieldBase_*,_std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>_>
  _Var8;
  _Base_ptr p_Var9;
  RequiredTagMissing *pRVar10;
  _Rb_tree_header *p_Var11;
  _Base_ptr p_Var12;
  DataDictionary *DD;
  int delim;
  string local_60;
  DataDictionary *local_40;
  int local_34;
  
  p_Var6 = (this->m_headerFields)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_40 = this;
  while( true ) {
    if ((_Rb_tree_header *)p_Var6 == &(this->m_headerFields)._M_t._M_impl.super__Rb_tree_header) {
      p_Var6 = (local_40->m_trailerFields)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      pNVar3 = &local_40->m_trailerFields;
      pDVar2 = local_40;
      while( true ) {
        local_40 = pDVar2;
        if ((_Rb_tree_header *)p_Var6 == &(pNVar3->_M_t)._M_impl.super__Rb_tree_header) {
          __k = &(msgType->super_StringField).super_FieldBase.m_string;
          cVar7 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                  ::find(&(pDVar2->m_requiredFields)._M_t,__k);
          if ((_Rb_tree_header *)cVar7._M_node !=
              &(pDVar2->m_requiredFields)._M_t._M_impl.super__Rb_tree_header) {
            p_Var9 = cVar7._M_node[2]._M_right;
            if (p_Var9 != (_Base_ptr)&cVar7._M_node[2]._M_parent) {
              _Var5._M_current =
                   (body->m_fields).
                   super__Vector_base<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              do {
                _Var8 = FieldMap::
                        lookup<__gnu_cxx::__normal_iterator<FIX::FieldBase_const*,std::vector<FIX::FieldBase,std::allocator<FIX::FieldBase>>>>
                                  (body,(body->m_fields).
                                        super__Vector_base<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>
                                        ._M_impl.super__Vector_impl_data._M_start,_Var5,
                                   p_Var9[1]._M_color);
                _Var5._M_current =
                     (body->m_fields).
                     super__Vector_base<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                if (_Var8._M_current == _Var5._M_current) {
                  pRVar10 = (RequiredTagMissing *)__cxa_allocate_exception(0x58);
                  _Var1 = p_Var9[1]._M_color;
                  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"");
                  RequiredTagMissing::RequiredTagMissing(pRVar10,_Var1,&local_60);
                  __cxa_throw(pRVar10,&RequiredTagMissing::typeinfo,FIX::Exception::~Exception);
                }
                p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
              } while (p_Var9 != (_Base_ptr)&cVar7._M_node[2]._M_parent);
            }
            p_Var9 = (body->m_groups)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            p_Var11 = &(body->m_groups)._M_t._M_impl.super__Rb_tree_header;
            if ((_Rb_tree_header *)p_Var9 != p_Var11) {
              do {
                local_60._M_dataplus._M_p = (pointer)0x0;
                bVar4 = getGroup(local_40,__k,p_Var9[1]._M_color,&local_34,
                                 (DataDictionary **)&local_60);
                if (bVar4) {
                  for (p_Var12 = p_Var9[1]._M_parent; p_Var12 != p_Var9[1]._M_left;
                      p_Var12 = (_Base_ptr)&p_Var12->_M_parent) {
                    header_00 = *(FieldMap **)p_Var12;
                    checkHasRequired((DataDictionary *)local_60._M_dataplus._M_p,header_00,header_00
                                     ,header_00,msgType);
                  }
                }
                p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
              } while ((_Rb_tree_header *)p_Var9 != p_Var11);
            }
          }
          return;
        }
        if ((p_Var6[1].field_0x4 == '\x01') &&
           (_Var5 = FieldMap::
                    lookup<__gnu_cxx::__normal_iterator<FIX::FieldBase_const*,std::vector<FIX::FieldBase,std::allocator<FIX::FieldBase>>>>
                              (trailer,(trailer->m_fields).
                                       super__Vector_base<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>
                                       ._M_impl.super__Vector_impl_data._M_start,
                               (trailer->m_fields).
                               super__Vector_base<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>.
                               _M_impl.super__Vector_impl_data._M_finish,p_Var6[1]._M_color),
           _Var5._M_current ==
           (trailer->m_fields).super__Vector_base<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>.
           _M_impl.super__Vector_impl_data._M_finish)) break;
        p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
        pDVar2 = local_40;
      }
      pRVar10 = (RequiredTagMissing *)__cxa_allocate_exception(0x58);
      _Var1 = p_Var6[1]._M_color;
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"");
      RequiredTagMissing::RequiredTagMissing(pRVar10,_Var1,&local_60);
      __cxa_throw(pRVar10,&RequiredTagMissing::typeinfo,FIX::Exception::~Exception);
    }
    if ((p_Var6[1].field_0x4 == '\x01') &&
       (_Var5 = FieldMap::
                lookup<__gnu_cxx::__normal_iterator<FIX::FieldBase_const*,std::vector<FIX::FieldBase,std::allocator<FIX::FieldBase>>>>
                          (header,(header->m_fields).
                                  super__Vector_base<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                           (header->m_fields).
                           super__Vector_base<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>.
                           _M_impl.super__Vector_impl_data._M_finish,p_Var6[1]._M_color),
       _Var5._M_current ==
       (header->m_fields).super__Vector_base<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>.
       _M_impl.super__Vector_impl_data._M_finish)) break;
    p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
  }
  pRVar10 = (RequiredTagMissing *)__cxa_allocate_exception(0x58);
  _Var1 = p_Var6[1]._M_color;
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"");
  RequiredTagMissing::RequiredTagMissing(pRVar10,_Var1,&local_60);
  __cxa_throw(pRVar10,&RequiredTagMissing::typeinfo,FIX::Exception::~Exception);
}

Assistant:

void checkHasRequired
  ( const FieldMap& header, const FieldMap& body, const FieldMap& trailer,
    const MsgType& msgType ) const
  EXCEPT ( RequiredTagMissing )
  {
    NonBodyFields::const_iterator iNBF;
    for( iNBF = m_headerFields.begin(); iNBF != m_headerFields.end(); ++iNBF )
    {
      if( iNBF->second == true && !header.isSetField(iNBF->first) )
        throw RequiredTagMissing( iNBF->first );
    }

    for( iNBF = m_trailerFields.begin(); iNBF != m_trailerFields.end(); ++iNBF )
    {
      if( iNBF->second == true && !trailer.isSetField(iNBF->first) )
        throw RequiredTagMissing( iNBF->first );
    }

    MsgTypeToField::const_iterator iM
      = m_requiredFields.find( msgType.getString() );
    if ( iM == m_requiredFields.end() ) return ;

    const MsgFields& fields = iM->second;
    MsgFields::const_iterator iF;
    for( iF = fields.begin(); iF != fields.end(); ++iF )
    {
      if( !body.isSetField(*iF) )
        throw RequiredTagMissing( *iF );
    }

    FieldMap::g_const_iterator groups;
    for( groups = body.g_begin(); groups != body.g_end(); ++groups )
    {
      int delim;
      const DataDictionary* DD = 0;
      int field = groups->first;
      if( getGroup( msgType.getValue(), field, delim, DD ) )
      {
        std::vector<FieldMap*>::const_iterator group;
        for( group = groups->second.begin(); group != groups->second.end(); ++group )
          DD->checkHasRequired( **group, **group, **group, msgType );
      }
    }
  }